

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O1

void __thiscall
duckdb::RleBpDecoder::GetBatch<unsigned_char>
          (RleBpDecoder *this,data_ptr_t values_target_ptr,uint32_t batch_size)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uchar *values;
  
  if (batch_size != 0) {
    uVar4 = 0;
    do {
      uVar1 = this->repeat_count_;
      uVar3 = (uint32_t)uVar4;
      if (uVar1 == 0) {
        uVar1 = this->literal_count_;
        if (uVar1 == 0) {
          NextCounts(this);
        }
        else {
          uVar2 = batch_size - uVar3;
          if (uVar1 <= batch_size - uVar3) {
            uVar2 = uVar1;
          }
          ParquetDecodeUtils::BitUnpack<unsigned_char>
                    (&this->buffer_,&this->bitpack_pos,values_target_ptr + uVar4,(ulong)uVar2,
                     (bitpacking_width_t)this->bit_width_);
          this->literal_count_ = this->literal_count_ - uVar2;
          uVar4 = (ulong)(uVar2 + uVar3);
        }
      }
      else {
        uVar2 = batch_size - uVar3;
        if (uVar1 <= batch_size - uVar3) {
          uVar2 = uVar1;
        }
        if (batch_size != uVar3) {
          memset(values_target_ptr + uVar4,(int)this->current_value_,(ulong)uVar2);
        }
        this->repeat_count_ = this->repeat_count_ - uVar2;
        uVar4 = (ulong)(uVar3 + uVar2);
      }
    } while ((uint)uVar4 < batch_size);
  }
  return;
}

Assistant:

void GetBatch(data_ptr_t values_target_ptr, const uint32_t batch_size) {
		auto values = reinterpret_cast<T *>(values_target_ptr);
		uint32_t values_read = 0;

		while (values_read < batch_size) {
			if (repeat_count_ > 0) {
				auto repeat_batch = MinValue<uint32_t>(batch_size - values_read, repeat_count_);
				std::fill_n(values + values_read, repeat_batch, static_cast<T>(current_value_));
				repeat_count_ -= repeat_batch;
				values_read += repeat_batch;
			} else if (literal_count_ > 0) {
				auto literal_batch = MinValue<uint32_t>(batch_size - values_read, literal_count_);
				ParquetDecodeUtils::BitUnpack<T>(buffer_, bitpack_pos, values + values_read, literal_batch, bit_width_);
				literal_count_ -= literal_batch;
				values_read += literal_batch;
			} else {
				NextCounts();
			}
		}
		D_ASSERT(values_read == batch_size);
	}